

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20250127::Cord::RemoveSuffix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *buffer;
  char *buffer_00;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  ulong uVar5;
  CordRepBtree *pCVar6;
  Nonnull<char_*> pcVar7;
  ulong extraout_RAX;
  ulong uVar8;
  CordRep *pCVar9;
  size_t i;
  AlphaNum *in_R9;
  CordRepBtree *pCVar10;
  CordRepBtree *tree;
  CordzUpdateScope scope;
  string death_message;
  string local_130;
  AlphaNum local_110;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  CordRepBtree *local_c0;
  char *local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  uVar5 = (ulong)(char)bVar3;
  if ((uVar5 & 1) == 0) {
    uVar8 = uVar5 >> 1;
  }
  else {
    uVar8 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar8 < n) {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Check n <= size() failed: ","");
    local_c0 = (CordRepBtree *)0x16;
    local_b8 = "Requested suffix size ";
    buffer = local_110.digits_;
    pcVar7 = numbers_internal::FastIntToBuffer(n,buffer);
    local_110.piece_._M_len = (size_t)(pcVar7 + -(long)buffer);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar5 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar5 & 1) == 0) {
      i = uVar5 >> 1;
    }
    else {
      i = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    buffer_00 = local_60.digits_;
    local_110.piece_._M_str = buffer;
    pcVar7 = numbers_internal::FastIntToBuffer(i,buffer_00);
    local_60.piece_._M_len = (long)pcVar7 - (long)buffer_00;
    local_60.piece_._M_str = buffer_00;
    StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&local_c0,&local_110,&local_90,&local_60,in_R9);
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  pCVar10 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar10 == (CordRepBtree *)0x0 || (bVar3 & 1) == 0) || ((pCVar10->super_CordRep).length != 0)
     ) {
    if (pCVar10 == (CordRepBtree *)0x0 || (uVar5 & 1) == 0) {
      if ((bVar3 & 1) != 0) {
        RemoveSuffix();
        goto LAB_0028eeef;
      }
      if (0x1f < bVar3) {
        __assert_fail("tag <= kMaxInline",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                      ,0xb9,"void absl::Cord::InlineRep::reduce_size(size_t)");
      }
      uVar5 = (ulong)(bVar3 >> 1);
      goto LAB_0028eca3;
    }
    local_110.piece_._M_len = (size_t)cord_internal::InlineData::cordz_info((InlineData *)this);
    if ((CordzInfo *)local_110.piece_._M_len != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Lock((CordzInfo *)local_110.piece_._M_len,kRemoveSuffix);
    }
    tree = pCVar10;
    if (((pCVar10->super_CordRep).tag == '\x02') &&
       (RemoveSuffix(), tree = local_c0, (extraout_RAX & 1) == 0)) {
      LOCK();
      pRVar1 = &(local_c0->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      cord_internal::CordRep::Unref((CordRep *)pCVar10);
    }
    uVar5 = (tree->super_CordRep).length;
    if (n < uVar5) {
      uVar4 = (tree->super_CordRep).tag;
      if (uVar4 == '\x05') {
LAB_0028ed7c:
        if (uVar5 - n == 0) {
          __assert_fail("n != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a4,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (uVar5 == 0) {
          __assert_fail("pos < rep->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a5,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (uVar5 < n) {
          __assert_fail("n <= rep->length - pos",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a6,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (n == 0) {
          LOCK();
          pRVar1 = &(tree->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          n = (size_t)tree;
        }
        else {
          if ((tree->super_CordRep).tag == '\x01') {
            pCVar9 = tree->edges_[0];
            pCVar10 = (CordRepBtree *)tree->edges_[1];
          }
          else {
            pCVar9 = (CordRep *)0x0;
            pCVar10 = tree;
          }
          pCVar6 = (CordRepBtree *)operator_new(0x20);
          (pCVar6->super_CordRep).length = 0;
          (pCVar6->super_CordRep).refcount = (atomic<int>)0x0;
          (pCVar6->super_CordRep).tag = '\0';
          (pCVar6->super_CordRep).storage[0] = '\0';
          (pCVar6->super_CordRep).storage[1] = '\0';
          (pCVar6->super_CordRep).storage[2] = '\0';
          (pCVar6->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (pCVar6->super_CordRep).length = uVar5 - n;
          (pCVar6->super_CordRep).tag = '\x01';
          pCVar6->edges_[0] = pCVar9;
          if (pCVar10 == (CordRepBtree *)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          pRVar1 = &(pCVar10->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          pCVar6->edges_[1] = &pCVar10->super_CordRep;
          n = (size_t)pCVar6;
        }
        LOCK();
        pRVar1 = &(tree->super_CordRep).refcount;
        uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + -2;
        UNLOCK();
        if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
LAB_0028f08c:
          __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0xac,
                        "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()")
          ;
        }
        if (uVar2 == 2) {
          cord_internal::CordRep::Destroy(&tree->super_CordRep);
        }
      }
      else if (uVar4 == '\x03') {
        n = (size_t)cord_internal::CordRepBtree::RemoveSuffix(tree,n);
      }
      else {
        if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
          uVar5 = (tree->super_CordRep).length;
          goto LAB_0028ed7c;
        }
        bVar3 = (tree->super_CordRep).tag;
        if (bVar3 != 1 && bVar3 < 6) {
          __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
        }
        (tree->super_CordRep).length = (tree->super_CordRep).length - n;
        n = (size_t)tree;
      }
    }
    else {
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_0028f08c;
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&tree->super_CordRep);
      }
      n = 0;
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4fe,
                    "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if ((CordRepBtree *)n == (CordRepBtree *)0x0) {
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    }
    else {
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)n;
    }
    this = (Cord *)local_110.piece_._M_len;
    if ((CordzInfo *)local_110.piece_._M_len == (CordzInfo *)0x0) goto LAB_0028ee46;
  }
  else {
LAB_0028eeef:
    RemoveSuffix();
    uVar5 = 0;
LAB_0028eca3:
    uVar8 = uVar5 - n;
    if (uVar5 < n) {
      __assert_fail("tag >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0xba,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    memset((void *)((long)this + uVar8 + 1),0,n);
    if (uVar8 < 0x10) {
      (this->contents_).data_.rep_.field_0.data[0] = (char)uVar8 * '\x02';
      return;
    }
    RemoveSuffix();
  }
  Mutex::AssertHeld(&((CordzInfo *)this)->mutex_);
  ((CordzInfo *)this)->rep_ = (CordRep *)n;
LAB_0028ee46:
  cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_110);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}